

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Asset::~Asset(Asset *this)

{
  std::__cxx11::string::~string((string *)&this->extensions_json_string);
  std::__cxx11::string::~string((string *)&this->extras_json_string);
  Value::~Value(&this->extras);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~_Rb_tree(&(this->extensions)._M_t);
  std::__cxx11::string::~string((string *)&this->copyright);
  std::__cxx11::string::~string((string *)&this->minVersion);
  std::__cxx11::string::~string((string *)&this->generator);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Asset() = default;